

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DeferForeignKey(Parse *pParse,int isDeferred)

{
  Table *pTVar1;
  FKey *pFVar2;
  
  pTVar1 = pParse->pNewTable;
  if (((pTVar1 != (Table *)0x0) && (pTVar1->eTabType == '\0')) &&
     (pFVar2 = (pTVar1->u).tab.pFKey, pFVar2 != (FKey *)0x0)) {
    pFVar2->isDeferred = (u8)isDeferred;
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeferForeignKey(Parse *pParse, int isDeferred){
#ifndef SQLITE_OMIT_FOREIGN_KEY
  Table *pTab;
  FKey *pFKey;
  if( (pTab = pParse->pNewTable)==0 ) return;
  if( NEVER(!IsOrdinaryTable(pTab)) ) return;
  if( (pFKey = pTab->u.tab.pFKey)==0 ) return;
  assert( isDeferred==0 || isDeferred==1 ); /* EV: R-30323-21917 */
  pFKey->isDeferred = (u8)isDeferred;
#endif
}